

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O1

void __thiscall
ExprWriterTest_CallExprPrecedence_Test::TestBody(ExprWriterTest_CallExprPrecedence_Test *this)

{
  vector<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  *this_00;
  bool bVar1;
  Impl *pIVar2;
  Impl *pIVar3;
  Function func;
  Impl *pIVar4;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *args_00;
  char *message;
  StringRef name;
  AssertionResult gtest_ar;
  Expr args [4];
  AssertHelper local_f0;
  string local_e8;
  internal local_c8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> local_b8;
  Impl *local_b0;
  Impl *local_a8;
  Impl *local_a0;
  BasicExprFactory<std::allocator<char>_> *local_90;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> local_88;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> local_58;
  
  local_90 = &(this->super_ExprWriterTest).super_ExprFactory;
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory.exprs_;
  local_b8.super_ExprBase.impl_ = (ExprBase)(Impl *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_b8);
  pIVar2 = (Impl *)operator_new__(0x40);
  pIVar2->kind_ = FIRST_REFERENCE;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar2;
  pIVar2[1].kind_ = UNKNOWN;
  local_b8.super_ExprBase.impl_ = (ExprBase)(Impl *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_b8);
  pIVar3 = (Impl *)operator_new__(0x40);
  pIVar3->kind_ = FIRST_REFERENCE;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar3;
  pIVar3[1].kind_ = FIRST_EXPR;
  local_b8.super_ExprBase.impl_ = (ExprBase)(Impl *)0x0;
  std::vector<mp::Function::Impl_const*,std::allocator<mp::Function::Impl_const*>>::
  emplace_back<mp::Function::Impl_const*>
            ((vector<mp::Function::Impl_const*,std::allocator<mp::Function::Impl_const*>> *)
             &(this->super_ExprWriterTest).super_ExprFactory.funcs_,(Impl **)&local_b8);
  name.size_ = 3;
  name.data_ = "foo";
  func = mp::BasicExprFactory<std::allocator<char>_>::CreateFunction
                   (local_90,(this->super_ExprWriterTest).super_ExprFactory.funcs_.
                             super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1,name,-1,NUMERIC);
  local_58.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.data_ = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)0x0;
  local_58.size_ = 0;
  local_b8.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeCall(&this->super_ExprWriterTest,func,&local_58);
  local_e8._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_e8);
  pIVar4 = (Impl *)operator_new__(0x80);
  pIVar4->kind_ = FIRST_EXPR;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar4;
  *(undefined8 *)(pIVar4 + 2) = 0x4014000000000000;
  local_e8._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_e8);
  local_b0 = (Impl *)operator_new__(0xc0);
  local_b0->kind_ = ADD;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = local_b0;
  *(Impl **)(local_b0 + 2) = pIVar2;
  *(Impl **)(local_b0 + 4) = pIVar4;
  local_e8._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_e8);
  local_a8 = (Impl *)operator_new__(0x80);
  local_a8->kind_ = FIRST_EXPR;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = local_a8;
  *(undefined8 *)(local_a8 + 2) = 0x401c000000000000;
  local_e8._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_e8);
  local_a0 = (Impl *)operator_new__(0x80);
  local_a0->kind_ = FLOOR;
  args_00 = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
            (this->super_ExprWriterTest).super_ExprFactory.exprs_.
            super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  args_00[-1].super_ExprBase.impl_ = local_a0;
  *(Impl **)(local_a0 + 2) = pIVar3;
  if (local_58.save_.
      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.save_.
                    super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.save_.
                          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.save_.
                          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_88.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.data_ = &local_b8;
  local_88.size_ = 4;
  local_f0.data_ =
       (AssertHelperData *)ExprWriterTest::MakeCall(&this->super_ExprWriterTest,func,&local_88);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_e8,(fmt *)0x1684bd,(CStringRef)&local_f0,args_00);
  testing::internal::CmpHelperEQ<char[33],std::__cxx11::string>
            (local_c8,"\"foo(foo(), x1 + 5, 7, floor(x2))\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeCall(f, args)))",
             (char (*) [33])"foo(foo(), x1 + 5, 7, floor(x2))",&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_88.save_.
      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.save_.
                    super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.save_.
                          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.save_.
                          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x22e,message);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_e8._M_dataplus._M_p + 8))();
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprWriterTest, CallExprPrecedence) {
  auto x1 = MakeVariable(0), x2 = MakeVariable(1);
  auto f = AddFunction("foo", -1);
  mp::Expr args[] = {
      MakeCall(f, mp::MakeArrayRef<mp::Expr>(0, 0)),
      MakeBinary(ex::ADD, x1, MakeConst(5)),
      MakeConst(7),
      MakeUnary(ex::FLOOR, x2)
  };
  CHECK_WRITE("foo(foo(), x1 + 5, 7, floor(x2))", MakeCall(f, args));
}